

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O3

void __thiscall
webfront::log::info<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
          (log *this,string_view fmt,basic_string_view<char,_std::char_traits<char>_> *ts,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  pointer pfVar1;
  _Alloc_hider _Var2;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *s;
  _Any_data *p_Var3;
  string_view fmt_00;
  string_view fmt_01;
  char local_91;
  string local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  if (logTypeEnabled._3_1_ == '\x01') {
    fmt_00._M_str = (char *)fmt._M_len;
    fmt_00._M_len = (size_t)this;
    std::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
              (&local_60,fmt_00,(basic_string_view<char,_std::char_traits<char>_> *)fmt._M_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts);
    local_38._M_len = local_60._M_string_length;
    local_38._M_str = local_60._M_dataplus._M_p;
    local_91 = 'I';
    local_40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    fmt_01._M_str = "[{}] {:%T} | {}";
    fmt_01._M_len = 0xf;
    std::
    format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::basic_string_view<char,std::char_traits<char>>&>
              (&local_90,fmt_01,&local_91,&local_40,&local_38);
    _Var2._M_p = local_90._M_dataplus._M_p;
    pfVar1 = Sinks::sinks.
             super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (Sinks::sinks.
        super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        Sinks::sinks.
        super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var3 = (_Any_data *)
               Sinks::sinks.
               super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (*(long *)(p_Var3 + 1) != 0) {
          local_70._M_len = local_90._M_string_length;
          local_70._M_str = _Var2._M_p;
          (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_70);
        }
        p_Var3 = p_Var3 + 2;
      } while (p_Var3 != (_Any_data *)pfVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

auto addSinks(auto&&... ts) { (out.sinks.push_back(std::forward<decltype(ts)>(ts)), ...); return out.sinks.size() - 1; }